

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void free_attr_list(attr_list list)

{
  void *__ptr;
  short *in_RDI;
  attr_opaque o;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  if ((in_RDI != (short *)0x0) && (in_RDI[1] = in_RDI[1] + -1, in_RDI[1] < 1)) {
    if (*in_RDI == 0) {
      for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2); iVar1 = iVar1 + 1) {
        switch(*(undefined4 *)(*(long *)(in_RDI + 4) + 4 + (long)iVar1 * 0x18)) {
        case 0:
        case 1:
        case 2:
        case 7:
        case 8:
        case 9:
          break;
        case 3:
          free(*(void **)(*(long *)(in_RDI + 4) + (long)iVar1 * 0x18 + 8));
          break;
        case 4:
          __ptr = *(void **)(*(long *)(in_RDI + 4) + (long)iVar1 * 0x18 + 0x10);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          break;
        case 5:
          break;
        case 6:
          free_attr_list((attr_list)CONCAT44(in_stack_fffffffffffffff4,iVar1));
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x5e4,"void free_attr_list(attr_list)");
        }
      }
      if (*(long *)(in_RDI + 4) != 0) {
        free(*(void **)(in_RDI + 4));
      }
      if (*(long *)(in_RDI + 8) != 0) {
        free(*(void **)(in_RDI + 8));
        in_RDI[8] = 0;
        in_RDI[9] = 0;
        in_RDI[10] = 0;
        in_RDI[0xb] = 0;
      }
      free(in_RDI);
    }
    else {
      for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 4); iVar1 = iVar1 + 1) {
        free_attr_list((attr_list)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      }
      free(*(void **)(in_RDI + 8));
      free(in_RDI);
    }
  }
  return;
}

Assistant:

void
free_attr_list(attr_list list)
{
    if (list == NULL) return;
    list->ref_count--;
    if (list->ref_count > 0) return;
    if (list->list_of_lists) {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            free_attr_list(list->l.lists.lists[i]);
        }
        free(list->l.lists.lists);
        free(list);
    } else {
        int i;
        for (i=0; i< list->l.list.iattrs->other_attr_count; i++) {
            switch (list->l.list.attributes[i].val_type) {
            case Attr_Undefined:
            case Attr_Int4:
            case Attr_Int8:
	    case Attr_Float16:
	    case Attr_Float8:
	    case Attr_Float4:
                break;
            case Attr_Atom:
                break;
            case Attr_String:
                free((char *)list->l.list.attributes[i].value.u.p);
                break;
            case Attr_Opaque: {
                attr_opaque o = list->l.list.attributes[i].value.u.o;
                if (o.buffer) {
                    free(o.buffer);
                }
                break;
            }
            case Attr_List:
                free_attr_list((attr_list)list->l.list.attributes[i].value.u.p);
                break;                  
            default:
                assert(0);
            }
        }
        if (list->l.list.attributes != NULL) {
            free(list->l.list.attributes);
        }
	if (list->l.list.iattrs != NULL) {
	    free(list->l.list.iattrs);
	    list->l.list.iattrs = NULL;
	}
        free(list);
    }      
}